

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::
GenerateSibling<google::protobuf::compiler::java::MessageGenerator,google::protobuf::Descriptor>
          (java *this,string *package_dir,string *java_package,Descriptor *descriptor,
          GeneratorContext *context,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *file_list,bool annotate_code,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *annotation_list,string *name_suffix,MessageGenerator *generator,
          offset_in_MessageGenerator_to_subr pfn)

{
  long *plVar1;
  ZeroCopyOutputStream *output;
  ZeroCopyOutputStream *output_00;
  char **ppcVar2;
  size_type *psVar3;
  AnnotationCollector *annotation_collector_00;
  undefined7 in_stack_00000009;
  string info_full_path;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  GeneratedCodeInfo annotations;
  Printer printer;
  char local_14c;
  value_type local_148;
  value_type local_128;
  string *local_108;
  string *local_100;
  AnnotationCollector local_f8;
  GeneratedCodeInfo *local_f0;
  undefined1 local_e8 [48];
  Printer local_b8;
  
  local_108 = java_package;
  local_100 = package_dir;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (java_package->_M_dataplus)._M_p);
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_e8,
                              (ulong)(annotation_list->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start);
  ppcVar2 = (char **)(plVar1 + 2);
  if ((char **)*plVar1 == ppcVar2) {
    local_b8.buffer_ = *ppcVar2;
    local_b8._24_8_ = plVar1[3];
    local_b8._0_8_ = &local_b8.buffer_;
  }
  else {
    local_b8.buffer_ = *ppcVar2;
    local_b8._0_8_ = (char **)*plVar1;
  }
  local_b8.output_ = (ZeroCopyOutputStream *)plVar1[1];
  *plVar1 = (long)ppcVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append(&local_b8.variable_delimiter_);
  psVar3 = (size_type *)(plVar1 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar1 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3) {
    local_148.field_2._M_allocated_capacity = *psVar3;
    local_148.field_2._8_8_ = plVar1[3];
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  }
  else {
    local_148.field_2._M_allocated_capacity = *psVar3;
    local_148._M_dataplus._M_p = (pointer)*plVar1;
  }
  local_148._M_string_length = plVar1[1];
  *plVar1 = (long)psVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if ((char **)local_b8._0_8_ != &local_b8.buffer_) {
    operator_delete((void *)local_b8._0_8_,(ulong)(local_b8.buffer_ + 1));
  }
  if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
    operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)context,&local_148);
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_128,local_148._M_dataplus._M_p,
             local_148._M_dataplus._M_p + local_148._M_string_length);
  std::__cxx11::string::append((char *)&local_128);
  GeneratedCodeInfo::GeneratedCodeInfo((GeneratedCodeInfo *)local_e8);
  local_f8._vptr_AnnotationCollector = (_func_int **)&PTR_AddAnnotation_00425e08;
  local_f0 = (GeneratedCodeInfo *)local_e8;
  output = (ZeroCopyOutputStream *)(**(code **)(*(long *)descriptor + 0x10))(descriptor,&local_148);
  local_14c = (char)file_list;
  annotation_collector_00 = &local_f8;
  if (local_14c == '\0') {
    annotation_collector_00 = (AnnotationCollector *)0x0;
  }
  io::Printer::Printer(&local_b8,output,'$',annotation_collector_00);
  io::Printer::Print(&local_b8,
                     "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n"
                     ,"filename",(string *)**(undefined8 **)&local_108->field_2);
  if (local_100->_M_string_length != 0) {
    io::Printer::Print(&local_b8,"package $package$;\n\n","package",local_100);
  }
  plVar1 = (long *)((long)&(name_suffix->_M_dataplus)._M_p + pfn);
  if (((ulong)generator & 1) != 0) {
    generator = *(MessageGenerator **)(*plVar1 + -1 + (long)generator);
  }
  (*(code *)generator)(plVar1,&local_b8);
  if (local_14c != '\0') {
    output_00 = (ZeroCopyOutputStream *)
                (**(code **)(*(long *)descriptor + 0x10))(descriptor,&local_128);
    MessageLite::SerializeToZeroCopyStream((MessageLite *)local_e8,output_00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT71(in_stack_00000009,annotate_code),&local_128);
    if (output_00 != (ZeroCopyOutputStream *)0x0) {
      (*output_00->_vptr_ZeroCopyOutputStream[1])(output_00);
    }
  }
  io::Printer::~Printer(&local_b8);
  if (output != (ZeroCopyOutputStream *)0x0) {
    (*output->_vptr_ZeroCopyOutputStream[1])(output);
  }
  GeneratedCodeInfo::~GeneratedCodeInfo((GeneratedCodeInfo *)local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void GenerateSibling(const string& package_dir,
                            const string& java_package,
                            const DescriptorClass* descriptor,
                            GeneratorContext* context,
                            std::vector<string>* file_list, bool annotate_code,
                            std::vector<string>* annotation_list,
                            const string& name_suffix,
                            GeneratorClass* generator,
                            void (GeneratorClass::*pfn)(io::Printer* printer)) {
  string filename = package_dir + descriptor->name() + name_suffix + ".java";
  file_list->push_back(filename);
  string info_full_path = filename + ".pb.meta";
  GeneratedCodeInfo annotations;
  io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
      &annotations);

  google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
  io::Printer printer(output.get(), '$',
                      annotate_code ? &annotation_collector : NULL);

  printer.Print(
    "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
    "// source: $filename$\n"
    "\n",
    "filename", descriptor->file()->name());
  if (!java_package.empty()) {
    printer.Print(
      "package $package$;\n"
      "\n",
      "package", java_package);
  }

  (generator->*pfn)(&printer);

  if (annotate_code) {
    google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> info_output(
        context->Open(info_full_path));
    annotations.SerializeToZeroCopyStream(info_output.get());
    annotation_list->push_back(info_full_path);
  }
}